

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BST.hpp
# Opt level: O2

optional<unsigned_long> __thiscall
supermap::BST<supermap::Key<2UL>,_unsigned_long,_unsigned_long>::getValue
          (BST<supermap::Key<2UL>,_unsigned_long,_unsigned_long> *this,Key<2UL> *key)

{
  _Storage<unsigned_long,_true> _Var1;
  mapped_type *pmVar2;
  undefined8 extraout_RDX;
  undefined8 uVar3;
  optional<unsigned_long> oVar4;
  
  _Var1 = (_Storage<unsigned_long,_true>)
          std::
          _Rb_tree<supermap::Key<2UL>,_std::pair<const_supermap::Key<2UL>,_unsigned_long>,_std::_Select1st<std::pair<const_supermap::Key<2UL>,_unsigned_long>_>,_std::less<supermap::Key<2UL>_>,_std::allocator<std::pair<const_supermap::Key<2UL>,_unsigned_long>_>_>
          ::find(&(this->map_)._M_t,key);
  if ((_Rb_tree_header *)_Var1._M_value == &(this->map_)._M_t._M_impl.super__Rb_tree_header) {
    uVar3 = 0;
  }
  else {
    pmVar2 = std::
             map<supermap::Key<2UL>,_unsigned_long,_std::less<supermap::Key<2UL>_>,_std::allocator<std::pair<const_supermap::Key<2UL>,_unsigned_long>_>_>
             ::operator[](&this->map_,key);
    _Var1._M_value = *pmVar2;
    uVar3 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  }
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar3;
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = _Var1._M_value;
  return (optional<unsigned_long>)
         oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<Value> getValue(const Key &key) override {
        if (map_.find(key) == map_.end()) {
            return std::nullopt;
        }
        return std::optional{map_[key]};
    }